

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O0

Box * __thiscall amrex::MFIter::growntilebox(MFIter *this,IntVect *ng)

{
  int iVar1;
  int iVar2;
  long in_RDX;
  MFIter *in_RSI;
  Box *in_RDI;
  int d;
  Box *vbx;
  int local_58;
  Box local_54;
  Box *local_38;
  long local_30;
  int local_1c;
  long local_18;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  local_30 = in_RDX;
  tilebox((MFIter *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  validbox(in_RSI);
  local_38 = &local_54;
  for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
    iVar1 = Box::smallEnd(in_RDI,local_58);
    iVar2 = Box::smallEnd(local_38,local_58);
    if (iVar1 == iVar2) {
      Box::growLo(in_RDI,local_58,*(int *)(local_30 + (long)local_58 * 4));
    }
    iVar1 = Box::bigEnd(in_RDI,local_58);
    iVar2 = Box::bigEnd(local_38,local_58);
    if (iVar1 == iVar2) {
      local_18 = local_30;
      local_1c = local_58;
      Box::growHi(in_RDI,local_58,*(int *)(local_30 + (long)local_58 * 4));
    }
  }
  return in_RDI;
}

Assistant:

Box
MFIter::growntilebox (const IntVect& ng) const noexcept
{
    Box bx = tilebox();
    const Box& vbx = validbox();
    for (int d=0; d<AMREX_SPACEDIM; ++d) {
        if (bx.smallEnd(d) == vbx.smallEnd(d)) {
            bx.growLo(d, ng[d]);
        }
        if (bx.bigEnd(d) == vbx.bigEnd(d)) {
            bx.growHi(d, ng[d]);
        }
    }
    return bx;
}